

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pminsh_mips(uint64_t fs,uint64_t ft)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  
  sVar1 = (short)fs;
  sVar6 = (short)ft;
  sVar2 = (short)(fs >> 0x10);
  sVar7 = (short)(ft >> 0x10);
  sVar3 = (short)(fs >> 0x20);
  sVar8 = (short)(ft >> 0x20);
  sVar5 = (short)(ft >> 0x30);
  sVar4 = (short)(fs >> 0x30);
  return CONCAT26((ushort)(sVar4 < sVar5) * sVar4 | (ushort)(sVar4 >= sVar5) * sVar5,
                  CONCAT24((ushort)(sVar3 < sVar8) * sVar3 | (ushort)(sVar3 >= sVar8) * sVar8,
                           CONCAT22((ushort)(sVar2 < sVar7) * sVar2 |
                                    (ushort)(sVar2 >= sVar7) * sVar7,
                                    (ushort)(sVar1 < sVar6) * sVar1 |
                                    (ushort)(sVar1 >= sVar6) * sVar6)));
}

Assistant:

uint64_t helper_pminsh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.sh[i] = (vs.sh[i] <= vt.sh[i] ? vs.sh[i] : vt.sh[i]);
    }
    return vs.d;
}